

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O0

sljit_s32 sljit_emit_ijump(sljit_compiler *compiler,sljit_s32 type,sljit_s32 src,sljit_sw srcw)

{
  sljit_jump *jump_00;
  undefined1 *puVar1;
  sljit_u8 *psVar2;
  byte bVar3;
  sljit_jump *jump;
  sljit_u8 *inst;
  sljit_sw srcw_local;
  sljit_s32 src_local;
  sljit_s32 type_local;
  sljit_compiler *compiler_local;
  
  if (compiler->error != 0) {
    return compiler->error;
  }
  if (src == 0x40) {
    jump_00 = (sljit_jump *)ensure_abuf(compiler,0x20);
    if (jump_00 == (sljit_jump *)0x0) {
      compiler->error = 2;
      return 2;
    }
    set_jump(jump_00,compiler,2);
    (jump_00->u).target = srcw;
    compiler->size = compiler->size + 0xd;
    puVar1 = (undefined1 *)ensure_buf(compiler,2);
    if (puVar1 == (undefined1 *)0x0) {
      compiler->error = 2;
      return 2;
    }
    *puVar1 = 0;
    puVar1[1] = (char)type + '\x02';
  }
  else {
    compiler->mode32 = 1;
    psVar2 = emit_x86_instruction(compiler,1,0,0,src,srcw);
    if (psVar2 == (sljit_u8 *)0x0) {
      return compiler->error;
    }
    *psVar2 = 0xff;
    bVar3 = 0x20;
    if (0x18 < type) {
      bVar3 = 0x10;
    }
    psVar2[1] = psVar2[1] | bVar3;
  }
  return 0;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_ijump(struct sljit_compiler *compiler, sljit_s32 type, sljit_s32 src, sljit_sw srcw)
{
	sljit_u8 *inst;
	struct sljit_jump *jump;

	CHECK_ERROR();
	CHECK(check_sljit_emit_ijump(compiler, type, src, srcw));
	ADJUST_LOCAL_OFFSET(src, srcw);

	CHECK_EXTRA_REGS(src, srcw, (void)0);

	if (src == SLJIT_IMM) {
		jump = (struct sljit_jump*)ensure_abuf(compiler, sizeof(struct sljit_jump));
		FAIL_IF_NULL(jump);
		set_jump(jump, compiler, JUMP_ADDR);
		jump->u.target = srcw;

		/* Worst case size. */
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
		compiler->size += 5;
#else
		compiler->size += 10 + 3;
#endif

		inst = (sljit_u8*)ensure_buf(compiler, 2);
		FAIL_IF_NULL(inst);

		*inst++ = 0;
		*inst++ = type + 2;
	}
	else {
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
		/* REX_W is not necessary (src is not immediate). */
		compiler->mode32 = 1;
#endif
		inst = emit_x86_instruction(compiler, 1, 0, 0, src, srcw);
		FAIL_IF(!inst);
		*inst++ = GROUP_FF;
		*inst |= (type >= SLJIT_FAST_CALL) ? CALL_rm : JMP_rm;
	}
	return SLJIT_SUCCESS;
}